

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int subjournalPageIfRequired(PgHdr *pPg)

{
  Pager *pPager_00;
  sqlite3_file *psVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  undefined8 in_RAX;
  long lVar8;
  ulong uVar9;
  Pager *pPager;
  uint uVar10;
  sqlite3_vfs *psVar11;
  long lVar12;
  long lVar13;
  int *piVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uStack_38;
  
  pPager_00 = pPg->pPager;
  iVar7 = pPager_00->nSavepoint;
  lVar12 = (long)iVar7;
  if (0 < lVar12) {
    uVar10 = pPg->pgno;
    piVar14 = &pPager_00->aSavepoint[4].bTruncateOnRelease;
    lVar13 = 0;
    uStack_38 = in_RAX;
    do {
      if ((uVar10 <= (uint)piVar14[-0x3a]) &&
         (iVar6 = sqlite3BitvecTestNotNull(*(Bitvec **)(piVar14 + -0x3c),uVar10),
         auVar5 = _DAT_001e3de0, auVar4 = _DAT_001e3dd0, auVar3 = _DAT_001e3dc0, iVar6 == 0)) {
        if (1 - (int)lVar13 < iVar7) {
          lVar8 = lVar12 + lVar13 + -2;
          auVar15._8_4_ = (int)lVar8;
          auVar15._0_8_ = lVar8;
          auVar15._12_4_ = (int)((ulong)lVar8 >> 0x20);
          uVar9 = 0;
          auVar15 = auVar15 ^ _DAT_001e3de0;
          do {
            auVar16._8_4_ = (int)uVar9;
            auVar16._0_8_ = uVar9;
            auVar16._12_4_ = (int)(uVar9 >> 0x20);
            auVar17 = (auVar16 | auVar4) ^ auVar5;
            iVar7 = auVar15._4_4_;
            if ((bool)(~(auVar17._4_4_ == iVar7 && auVar15._0_4_ < auVar17._0_4_ ||
                        iVar7 < auVar17._4_4_) & 1)) {
              piVar14[-0x2a] = 0;
            }
            if ((auVar17._12_4_ != auVar15._12_4_ || auVar17._8_4_ <= auVar15._8_4_) &&
                auVar17._12_4_ <= auVar15._12_4_) {
              piVar14[-0x1c] = 0;
            }
            auVar16 = (auVar16 | auVar3) ^ auVar5;
            iVar6 = auVar16._4_4_;
            if (iVar6 <= iVar7 && (iVar6 != iVar7 || auVar16._0_4_ <= auVar15._0_4_)) {
              piVar14[-0xe] = 0;
              *piVar14 = 0;
            }
            uVar9 = uVar9 + 4;
            piVar14 = piVar14 + 0x38;
          } while ((lVar12 + lVar13 + 2U & 0xfffffffffffffffc) != uVar9);
        }
        iVar7 = sqlite3Config.nStmtSpill;
        if (pPager_00->journalMode == '\x02') goto LAB_00148fed;
        psVar1 = pPager_00->sjfd;
        if (psVar1->pMethods == (sqlite3_io_methods *)0x0) {
          if ((pPager_00->journalMode == '\x04') || (pPager_00->subjInMemory != '\0')) {
            psVar11 = pPager_00->pVfs;
            *(undefined1 (*) [16])(psVar1 + 6) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(psVar1 + 4) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(psVar1 + 2) = (undefined1  [16])0x0;
            iVar7 = -1;
            iVar6 = 0x3f8;
          }
          else {
            psVar11 = pPager_00->pVfs;
            *(undefined1 (*) [16])(psVar1 + 8) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(psVar1 + 6) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(psVar1 + 4) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(psVar1 + 2) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])psVar1 = (undefined1  [16])0x0;
            if (iVar7 == 0) {
              iVar7 = (*psVar11->xOpen)((sqlite3_file *)psVar11,0);
              if (iVar7 != 0) {
                return iVar7;
              }
              goto LAB_0014905a;
            }
            iVar6 = 0x3f8;
            if (0 < iVar7) {
              iVar6 = iVar7;
            }
          }
          *(int *)&psVar1[1].pMethods = iVar6;
          psVar1->pMethods = &MemJournalMethods;
          *(int *)((long)&psVar1[1].pMethods + 4) = iVar7;
          *(undefined4 *)&psVar1[7].pMethods = 0x201e;
          psVar1[9].pMethods = (sqlite3_io_methods *)0x0;
          psVar1[8].pMethods = (sqlite3_io_methods *)psVar11;
        }
LAB_0014905a:
        pvVar2 = pPg->pData;
        lVar12 = (pPager_00->pageSize + 4) * (ulong)pPager_00->nSubRec;
        uVar10 = pPg->pgno;
        uStack_38 = CONCAT44(uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                             uVar10 << 0x18,(undefined4)uStack_38);
        iVar7 = (*pPager_00->sjfd->pMethods->xWrite)
                          (pPager_00->sjfd,(void *)((long)&uStack_38 + 4),4,lVar12);
        if (iVar7 != 0) {
          return iVar7;
        }
        iVar7 = (*pPager_00->sjfd->pMethods->xWrite)
                          (pPager_00->sjfd,pvVar2,(int)pPager_00->pageSize,lVar12 + 4);
        if (iVar7 != 0) {
          return iVar7;
        }
        uVar10 = pPg->pgno;
LAB_00148fed:
        pPager_00->nSubRec = pPager_00->nSubRec + 1;
        iVar7 = addToSavepointBitvecs(pPager_00,uVar10);
        return iVar7;
      }
      piVar14 = piVar14 + 0xe;
      lVar13 = lVar13 + -1;
    } while (lVar12 + lVar13 != 0);
  }
  return 0;
}

Assistant:

static int subjournalPageIfRequired(PgHdr *pPg){
  if( subjRequiresPage(pPg) ){
    return subjournalPage(pPg);
  }else{
    return SQLITE_OK;
  }
}